

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int calc_verify_data(void *output,st_ptls_key_schedule_t *sched,void *secret)

{
  ptls_hash_algorithm_t *algo;
  size_t outlen;
  ptls_hash_context_t *ppVar1;
  ptls_iovec_t secret_00;
  ptls_iovec_t hash_value;
  undefined1 local_78 [4];
  int ret;
  uint8_t digest [64];
  ptls_hash_context_t *hmac;
  void *secret_local;
  st_ptls_key_schedule_t *sched_local;
  void *output_local;
  
  algo = sched->algo;
  outlen = sched->algo->digest_size;
  secret_00 = ptls_iovec_init(secret,sched->algo->digest_size);
  hash_value = ptls_iovec_init((void *)0x0,0);
  output_local._4_4_ = hkdf_expand_label(algo,local_78,outlen,secret_00,"finished",hash_value);
  if (output_local._4_4_ == 0) {
    ppVar1 = ptls_hmac_create(sched->algo,local_78,sched->algo->digest_size);
    if (ppVar1 == (ptls_hash_context_t *)0x0) {
      (*ptls_clear_memory)(local_78,0x40);
      output_local._4_4_ = 0x201;
    }
    else {
      (*sched->msghash->final)(sched->msghash,local_78,PTLS_HASH_FINAL_MODE_SNAPSHOT);
      (*ppVar1->update)(ppVar1,local_78,sched->algo->digest_size);
      (*ptls_clear_memory)(local_78,0x40);
      (*ppVar1->final)(ppVar1,output,PTLS_HASH_FINAL_MODE_FREE);
      output_local._4_4_ = 0;
    }
  }
  return output_local._4_4_;
}

Assistant:

static int calc_verify_data(void *output, struct st_ptls_key_schedule_t *sched, const void *secret)
{
    ptls_hash_context_t *hmac;
    uint8_t digest[PTLS_MAX_DIGEST_SIZE];
    int ret;

    if ((ret = hkdf_expand_label(sched->algo, digest, sched->algo->digest_size, ptls_iovec_init(secret, sched->algo->digest_size),
                                 "finished", ptls_iovec_init(NULL, 0))) != 0)
        return ret;
    if ((hmac = ptls_hmac_create(sched->algo, digest, sched->algo->digest_size)) == NULL) {
        ptls_clear_memory(digest, sizeof(digest));
        return PTLS_ERROR_NO_MEMORY;
    }

    sched->msghash->final(sched->msghash, digest, PTLS_HASH_FINAL_MODE_SNAPSHOT);
    PTLS_DEBUGF("%s: %02x%02x,%02x%02x\n", __FUNCTION__, ((uint8_t *)secret)[0], ((uint8_t *)secret)[1], digest[0], digest[1]);
    hmac->update(hmac, digest, sched->algo->digest_size);
    ptls_clear_memory(digest, sizeof(digest));
    hmac->final(hmac, output, PTLS_HASH_FINAL_MODE_FREE);

    return 0;
}